

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_subbytes_op(sexp ctx,sexp self,sexp_sint_t n,sexp vec,sexp start,sexp end)

{
  sexp n_00;
  sexp in_RCX;
  sexp in_RDX;
  long in_RDI;
  ulong in_R8;
  undefined8 in_R9;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp str;
  sexp res;
  sexp_uint_t in_stack_ffffffffffffffa0;
  sexp in_stack_ffffffffffffffa8;
  sexp_uint_t in_stack_ffffffffffffffb0;
  sexp ctx_00;
  sexp psVar1;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  psVar1 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 8)) {
    if ((in_R8 & 1) == 1) {
      if ((sexp)in_R9 == (sexp)&DAT_0000003e) {
        in_R9 = (in_RCX->value).stack.length << 1 | 1;
      }
      if ((in_R9 & 1) == 1) {
        psVar1 = (sexp)&stack0xffffffffffffffb8;
        ctx_00 = *(sexp *)(in_RDI + 0x6080);
        *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa8;
        n_00 = sexp_alloc_tagged_aux(ctx_00,(size_t)psVar1,in_stack_ffffffffffffffa0);
        (n_00->value).type.name = in_RCX;
        (n_00->value).type.cpl = (sexp)0x0;
        (n_00->value).type.slots = (sexp)(in_RCX->value).flonum;
        local_8 = sexp_substring_op((sexp)in_R9,(sexp)in_stack_ffffffffffffffc0,(sexp_sint_t)n_00,
                                    ctx_00,psVar1,in_RDX);
        if (((local_8 & 3) != 0) || (((sexp)local_8)->tag != 0x13)) {
          local_8 = (((sexp)local_8)->value).flonum;
        }
        *(sexp *)(in_RDI + 0x6080) = ctx_00;
      }
      else {
        local_8 = sexp_type_exception((sexp)in_stack_ffffffffffffffc0,psVar1,
                                      in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
    }
    else {
      local_8 = sexp_type_exception((sexp)in_stack_ffffffffffffffc0,psVar1,in_stack_ffffffffffffffb0
                                    ,in_stack_ffffffffffffffa8);
    }
  }
  else {
    local_8 = sexp_type_exception((sexp)in_stack_ffffffffffffffc0,psVar1,in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffa8);
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_subbytes_op (sexp ctx, sexp self, sexp_sint_t n, sexp vec, sexp start, sexp end) {
  sexp res;
  sexp_gc_var1(str);
  sexp_assert_type(ctx, sexp_bytesp, SEXP_BYTES, vec);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, start);
  if (sexp_not(end))
    end = sexp_make_fixnum(sexp_bytes_length(vec));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, end);
  sexp_gc_preserve1(ctx, str);
#if SEXP_USE_PACKED_STRINGS
  str = sexp_c_string(ctx, sexp_bytes_data(vec), sexp_bytes_length(vec));
#else
  str = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(str) = vec;
  sexp_string_offset(str) = 0;
  sexp_string_size(str) = sexp_bytes_length(vec);
#endif
  res = sexp_substring_op(ctx, self, n, str, sexp_fixnum_to_string_cursor(start), sexp_fixnum_to_string_cursor(end));
  if (!sexp_exceptionp(res))
    res = sexp_string_to_bytes(ctx, res);
  sexp_gc_release1(ctx);
  return res;
}